

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedBreakIterator::BreakCache::following
          (BreakCache *this,int32_t startPos,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  int32_t startPos_local;
  BreakCache *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if ((UVar1 == '\0') &&
     (((startPos == this->fTextIdx || (UVar1 = seek(this,startPos), UVar1 != '\0')) ||
      (UVar1 = populateNear(this,startPos,status), UVar1 != '\0')))) {
    this->fBI->fDone = '\0';
    next(this);
  }
  return;
}

Assistant:

void RuleBasedBreakIterator::BreakCache::following(int32_t startPos, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return;
    }
    if (startPos == fTextIdx || seek(startPos) || populateNear(startPos, status)) {
        // startPos is in the cache. Do a next() from that position.
        // TODO: an awkward set of interactions with bi->fDone
        //       seek() does not clear it; it can't because of interactions with populateNear().
        //       next() does not clear it in the fast-path case, where everything matters. Maybe it should.
        //       So clear it here, for the case where seek() succeeded on an iterator that had previously run off the end.
        fBI->fDone = false;
        next();
    }
    return;
}